

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_os_socket_setsockopt(int sock,int level,int optname,void *optval,size_t optlen)

{
  int iVar1;
  void *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  socklen_t in_R8D;
  
  iVar1 = setsockopt(in_EDI,in_ESI,in_EDX,in_RCX,in_R8D);
  return iVar1;
}

Assistant:

static int
amqp_os_socket_setsockopt(int sock, int level, int optname,
                       const void *optval, size_t optlen)
{
#ifdef _WIN32
  /* the winsock setsockopt function has its 4th argument as a
     const char * */
  return setsockopt(sock, level, optname, (const char *)optval, optlen);
#else
  return setsockopt(sock, level, optname, optval, optlen);
#endif
}